

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-send-unreachable.c
# Opt level: O0

void send_cb_recverr(uv_udp_send_t *req,int status)

{
  bool bVar1;
  int64_t eval_b_1;
  int64_t eval_a_1;
  void *eval_b;
  void *eval_a;
  int status_local;
  uv_udp_send_t *req_local;
  
  if (req == (uv_udp_send_t *)0x0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-send-unreachable.c"
            ,0x47,"req","!=","((void*)0)",0,"!=",0);
    abort();
  }
  if ((status != 0) && (status != -0x6f)) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-send-unreachable.c"
            ,0x48,"status == 0 || status == UV_ECONNREFUSED");
    abort();
  }
  bVar1 = true;
  if (req->handle != &client) {
    bVar1 = req->handle == &client2;
  }
  if (!bVar1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-send-unreachable.c"
            ,0x49,"(uv_udp_t*)(req->handle) == &client || (uv_udp_t*)(req->handle) == &client2","!="
            ,"0",0,"!=",0);
    abort();
  }
  send_cb_called = send_cb_called + 1;
  return;
}

Assistant:

static void send_cb_recverr(uv_udp_send_t* req, int status) {
  ASSERT_PTR_NE(req, NULL);
  ASSERT(status == 0 || status == UV_ECONNREFUSED);
  CHECK_HANDLE(req->handle);
  send_cb_called++;
}